

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O1

void array_container_printf(array_container_t *v)

{
  long lVar1;
  
  if (v->cardinality != 0) {
    putchar(0x7b);
    printf("%d",(ulong)*v->array);
    if (1 < v->cardinality) {
      lVar1 = 1;
      do {
        printf(",%d",(ulong)v->array[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < v->cardinality);
    }
    putchar(0x7d);
    return;
  }
  printf("{}");
  return;
}

Assistant:

void array_container_printf(const array_container_t *v) {
    if (v->cardinality == 0) {
        printf("{}");
        return;
    }
    printf("{");
    printf("%d", v->array[0]);
    for (int i = 1; i < v->cardinality; ++i) {
        printf(",%d", v->array[i]);
    }
    printf("}");
}